

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O3

string * __thiscall
upb::generator::(anonymous_namespace)::MapValueSize_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,FieldDefPtr map_field,
          string_view expr)

{
  _Bool _Var1;
  upb_CType uVar2;
  upb_MessageDef *m;
  upb_FieldDef *f;
  string *psVar3;
  char *pcVar4;
  string_view expr_00;
  
  pcVar4 = expr._M_str;
  expr_00._M_len = expr._M_len;
  m = upb_FieldDef_MessageSubDef((upb_FieldDef *)this);
  _Var1 = upb_MessageDef_IsMapEntry(m);
  if (_Var1) {
    f = upb_MessageDef_Field(m,1);
  }
  else {
    f = (upb_FieldDef *)0x0;
  }
  uVar2 = upb_FieldDef_CType(f);
  expr_00._M_str = pcVar4;
  psVar3 = MapKeyValueSize_abi_cxx11_
                     (__return_storage_ptr__,(_anonymous_namespace_ *)(ulong)uVar2,
                      (upb_CType)map_field.ptr_,expr_00);
  return psVar3;
}

Assistant:

std::string MapValueSize(upb::FieldDefPtr map_field, absl::string_view expr) {
  const upb_CType ctype = map_field.message_type().map_value().ctype();
  return MapKeyValueSize(ctype, expr);
}